

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * int8ToStr_abi_cxx11_(string *__return_storage_ptr__,int8_t *x)

{
  ostringstream local_190 [8];
  ostringstream str;
  int8_t *x_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<(local_190,(int)*x);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

string int8ToStr(const int8_t& x)
{
    std::ostringstream str;
    str << x;
    return str.str();
}